

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

Vector<Kernel::TermList> * Lib::Vector<Kernel::TermList>::allocate(size_t length)

{
  void *placement;
  Vector<Kernel::TermList> *length_00;
  long in_RDI;
  TermList *arr;
  Vector<Kernel::TermList> *v;
  size_t sz;
  size_t in_stack_ffffffffffffffe0;
  
  placement = (void *)((in_RDI + -1) * 8 + 0x10);
  length_00 = (Vector<Kernel::TermList> *)Lib::alloc(in_stack_ffffffffffffffe0);
  *(long *)length_00 = in_RDI;
  array_new<Kernel::TermList>(placement,(size_t)length_00);
  return length_00;
}

Assistant:

static Vector* allocate(size_t length)
  {
    ASS_G(length,0);

    size_t sz=sizeof(Vector) + (length-1)*sizeof(C);
    Vector* v = reinterpret_cast<Vector*>(ALLOC_KNOWN(sz,"Vector"));
    v->_length = length;
    C* arr = v->_array;
    // in the case C is a class with an initialiser, apply the constructor of it
    // to every element of the allocated array
    array_new<C>(arr,length);
    return v;
  }